

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paex_record.c
# Opt level: O0

int playCallback(void *inputBuffer,void *outputBuffer,unsigned_long framesPerBuffer,
                PaStreamCallbackTimeInfo *timeInfo,PaStreamCallbackFlags statusFlags,void *userData)

{
  uint uVar1;
  SAMPLE *pSVar2;
  SAMPLE *pSVar3;
  int local_58;
  uint framesLeft;
  int finished;
  uint i;
  SAMPLE *wptr;
  SAMPLE *rptr;
  paTestData *data;
  void *userData_local;
  PaStreamCallbackFlags statusFlags_local;
  PaStreamCallbackTimeInfo *timeInfo_local;
  unsigned_long framesPerBuffer_local;
  void *outputBuffer_local;
  void *inputBuffer_local;
  
  wptr = (SAMPLE *)(*(long *)((long)userData + 8) + (long)(*userData << 1) * 4);
  uVar1 = *(int *)((long)userData + 4) - *userData;
  _finished = (SAMPLE *)outputBuffer;
  if (uVar1 < framesPerBuffer) {
    for (framesLeft = 0; framesLeft < uVar1; framesLeft = framesLeft + 1) {
      pSVar2 = wptr + 1;
      pSVar3 = _finished + 1;
      *_finished = *wptr;
      wptr = wptr + 2;
      _finished = _finished + 2;
      *pSVar3 = *pSVar2;
    }
    for (; framesLeft < framesPerBuffer; framesLeft = framesLeft + 1) {
      pSVar2 = _finished + 1;
      *_finished = 0.0;
      _finished = _finished + 2;
      *pSVar2 = 0.0;
    }
    *(uint *)userData = uVar1 + *userData;
    local_58 = 1;
  }
  else {
    for (framesLeft = 0; framesLeft < framesPerBuffer; framesLeft = framesLeft + 1) {
      pSVar2 = wptr + 1;
      pSVar3 = _finished + 1;
      *_finished = *wptr;
      wptr = wptr + 2;
      _finished = _finished + 2;
      *pSVar3 = *pSVar2;
    }
    *(int *)userData = *userData + (int)framesPerBuffer;
    local_58 = 0;
  }
  return local_58;
}

Assistant:

static int playCallback( const void *inputBuffer, void *outputBuffer,
                         unsigned long framesPerBuffer,
                         const PaStreamCallbackTimeInfo* timeInfo,
                         PaStreamCallbackFlags statusFlags,
                         void *userData )
{
    paTestData *data = (paTestData*)userData;
    SAMPLE *rptr = &data->recordedSamples[data->frameIndex * NUM_CHANNELS];
    SAMPLE *wptr = (SAMPLE*)outputBuffer;
    unsigned int i;
    int finished;
    unsigned int framesLeft = data->maxFrameIndex - data->frameIndex;

    (void) inputBuffer; /* Prevent unused variable warnings. */
    (void) timeInfo;
    (void) statusFlags;
    (void) userData;

    if( framesLeft < framesPerBuffer )
    {
        /* final buffer... */
        for( i=0; i<framesLeft; i++ )
        {
            *wptr++ = *rptr++;  /* left */
            if( NUM_CHANNELS == 2 ) *wptr++ = *rptr++;  /* right */
        }
        for( ; i<framesPerBuffer; i++ )
        {
            *wptr++ = 0;  /* left */
            if( NUM_CHANNELS == 2 ) *wptr++ = 0;  /* right */
        }
        data->frameIndex += framesLeft;
        finished = paComplete;
    }
    else
    {
        for( i=0; i<framesPerBuffer; i++ )
        {
            *wptr++ = *rptr++;  /* left */
            if( NUM_CHANNELS == 2 ) *wptr++ = *rptr++;  /* right */
        }
        data->frameIndex += framesPerBuffer;
        finished = paContinue;
    }
    return finished;
}